

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_gen_keys.c
# Opt level: O3

int main(void)

{
  int iVar1;
  long lVar2;
  ulp_ring_private_key *priv_key;
  ulp_ring_public_key *pub_key;
  ulp_ring_private_key *local_20;
  ulp_ring_public_key *local_18;
  
  local_18 = (ulp_ring_public_key *)0x0;
  local_20 = (ulp_ring_private_key *)0x0;
  iVar1 = ulp_ring_generate_key_pair(0x100,0x1da7e,0x1fe2f37,0x3f8c027d93dd95,&local_18,&local_20);
  if ((((local_18 != (ulp_ring_public_key *)0x0 && iVar1 == 0) && (local_18->n == 0x100)) &&
      (local_18->q == 0x3f8c027d93dd95)) &&
     ((local_18->se == 0x1fe2f37 && (local_18->a != (uint64_t *)0x0)))) {
    if (((local_20 != (ulp_ring_private_key *)0x0 && local_18->p != (uint64_t *)0x0) &&
        ((local_20->n == 0x100 && (local_20->q == 0x3f8c027d93dd95)))) &&
       (local_20->s != (uint64_t *)0x0)) {
      lVar2 = 0;
      do {
        if (((0x3f8c027d93dd94 < local_18->a[lVar2]) || (0x3f8c027d93dd94 < local_18->p[lVar2])) ||
           (0x1da7d < local_20->s[lVar2])) goto LAB_00101265;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x100);
      ulp_ring_free_public_key(local_18);
      iVar1 = 0;
      goto LAB_0010126f;
    }
  }
LAB_00101265:
  ulp_ring_free_public_key(local_18);
  iVar1 = 1;
LAB_0010126f:
  ulp_ring_free_private_key(local_20);
  return iVar1;
}

Assistant:

int main() {

    ulp_ring_public_key* pub_key = NULL;
    ulp_ring_private_key* priv_key = NULL;

    size_t n = 256;
    uint64_t sk = 121470;
    uint64_t se = 33435447;
    uint64_t q = 17886865857437077;

    // generate key pair and do sanity checks

    if(ulp_ring_generate_key_pair(n, sk, se, q, &pub_key, &priv_key) != 0)
        goto error;

    if(pub_key == NULL || pub_key->n != n || pub_key->q != q || pub_key->se != se || pub_key->a == NULL || pub_key->p == NULL)
        goto error;

    if(priv_key == NULL || priv_key->n != n || priv_key->q != q || priv_key->s == NULL)
        goto error;

    // check if values are below thresholds

    for(size_t i = 0; i < n; i++) {
        if(pub_key->a[i] >= q || pub_key->p[i] >= q || priv_key->s[i] >= sk)
            goto error;
    }

    ulp_ring_free_public_key(pub_key);
    ulp_ring_free_private_key(priv_key);
    return 0;


    error:
        ulp_ring_free_public_key(pub_key);
        ulp_ring_free_private_key(priv_key);
        return 1;

}